

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O3

CURLcode ftp_parse_url_path(connectdata *conn)

{
  int *piVar1;
  curl_ftpfile cVar2;
  char *pcVar3;
  ftp_conn *pfVar4;
  _Bool _Var5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  char **ppcVar9;
  char *pcVar10;
  char *pcVar11;
  CURLcode CVar12;
  FTP *pFVar13;
  ftp_conn *ftpc;
  SessionHandle *pSVar14;
  SessionHandle *pSVar15;
  ulong uVar16;
  int dlen;
  int local_4c;
  ftp_conn *local_48;
  SessionHandle *local_40;
  FTP *local_38;
  
  pSVar14 = conn->data;
  pcVar11 = (pSVar14->state).path;
  pFVar13 = (pSVar14->state).proto.ftp;
  ftpc = (ftp_conn *)&conn->proto;
  (conn->proto).ftpc.ctl_valid = false;
  (conn->proto).ftpc.cwdfail = false;
  cVar2 = (pSVar14->set).ftp_filemethod;
  pSVar15 = pSVar14;
  if (cVar2 == FTPFILE_SINGLECWD) {
    if (*pcVar11 == '\0') {
      (conn->proto).ftpc.dirdepth = 0;
      goto LAB_00117c91;
    }
    pcVar10 = strrchr(pcVar11,0x2f);
    if (pcVar10 == (char *)0x0) goto LAB_00117cc2;
    ppcVar9 = (char **)(*Curl_ccalloc)(1,8);
    (conn->proto).ftpc.dirs = ppcVar9;
    if (ppcVar9 == (char **)0x0) goto LAB_00117f1c;
    pSVar14 = conn->data;
    local_38 = pFVar13;
    iVar6 = curlx_sztosi((long)pcVar10 - (long)pcVar11);
    pcVar11 = curl_easy_unescape(pSVar14,pcVar11,iVar6,(int *)0x0);
    *(conn->proto).ftpc.dirs = pcVar11;
    if (*(conn->proto).ftpc.dirs != (char *)0x0) {
      (conn->proto).ftpc.dirdepth = 1;
      pcVar11 = pcVar10 + 1;
      pFVar13 = local_38;
      goto LAB_00117c7a;
    }
LAB_00117f17:
    freedirs(ftpc);
LAB_00117f1c:
    CVar12 = CURLE_OUT_OF_MEMORY;
  }
  else {
    if (cVar2 == FTPFILE_NOCWD) {
      if (((pcVar11 == (char *)0x0) || (*pcVar11 == '\0')) ||
         (sVar8 = strlen(pcVar11), pcVar11[sVar8 - 1] == '/')) goto LAB_00117c91;
    }
    else {
      (conn->proto).imapc.idstr = (char *)0x500000000;
      ppcVar9 = (char **)(*Curl_ccalloc)(5,8);
      (conn->proto).ftpc.dirs = ppcVar9;
      if (ppcVar9 == (char **)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      iVar6 = curl_strequal(pcVar11,"/");
      if (iVar6 == 0) {
        pcVar10 = strchr(pcVar11,0x2f);
        pfVar4 = ftpc;
        if (pcVar10 == (char *)0x0) {
          if (pcVar11 == (char *)0x0) goto LAB_00117c91;
        }
        else {
          do {
            local_40 = pSVar14;
            local_48 = pfVar4;
            pcVar3 = (local_40->state).path;
            uVar16 = 0;
            if (pcVar11 != pcVar3 && -1 < (long)pcVar11 - (long)pcVar3) {
              uVar16 = (ulong)((conn->proto).ftpc.dirdepth == 0);
            }
            if ((long)pcVar10 - (long)pcVar11 != 0) {
              iVar6 = curlx_sztosi(((long)pcVar10 - (long)pcVar11) + uVar16);
              pcVar11 = curl_easy_unescape(conn->data,pcVar11 + -uVar16,iVar6,(int *)0x0);
              iVar6 = (conn->proto).ftpc.dirdepth;
              (conn->proto).ftpc.dirs[iVar6] = pcVar11;
              ppcVar9 = (conn->proto).ftpc.dirs;
              pcVar11 = ppcVar9[iVar6];
              if (pcVar11 == (char *)0x0) {
                Curl_failf(local_40,"no memory");
                ftpc = local_48;
                goto LAB_00117f17;
              }
              _Var5 = isBadFtpString(pcVar11);
              ftpc = local_48;
              if (_Var5) {
                (*Curl_cfree)(pcVar11);
                ftpc = local_48;
                goto LAB_00117ced;
              }
              (conn->proto).ftpc.dirdepth = iVar6 + 1;
              iVar7 = (conn->proto).ftpc.diralloc;
              if (iVar7 <= iVar6 + 1) {
                (conn->proto).ftpc.diralloc = iVar7 * 2;
                ppcVar9 = (char **)(*Curl_crealloc)(ppcVar9,(long)iVar7 << 4);
                if (ppcVar9 == (char **)0x0) goto LAB_00117f17;
                (conn->proto).ftpc.dirs = ppcVar9;
              }
            }
            pcVar11 = pcVar10 + 1;
            pcVar10 = strchr(pcVar11,0x2f);
            pSVar15 = local_40;
            pfVar4 = local_48;
            pSVar14 = local_40;
          } while (pcVar10 != (char *)0x0);
        }
      }
      else {
        pcVar11 = pcVar11 + 1;
        pcVar10 = (*Curl_cstrdup)("/");
        *(conn->proto).ftpc.dirs = pcVar10;
        piVar1 = &(conn->proto).ftpc.dirdepth;
        *piVar1 = *piVar1 + 1;
      }
    }
LAB_00117c7a:
    pSVar14 = pSVar15;
    if (*pcVar11 == '\0') {
LAB_00117c91:
      (conn->proto).ftpc.file = (char *)0x0;
      pSVar15 = pSVar14;
      if (((pSVar14->set).upload != true) || (pFVar13->transfer != FTPTRANSFER_BODY)) {
LAB_00117cfc:
        (conn->proto).ftpc.cwddone = false;
        if ((conn->proto).ftpc.prevpath == (char *)0x0) {
          return CURLE_OK;
        }
        iVar6 = 0;
        pcVar11 = curl_easy_unescape(conn->data,(pSVar15->state).path,0,&local_4c);
        if (pcVar11 != (char *)0x0) {
          pcVar10 = (conn->proto).ftpc.file;
          if (pcVar10 != (char *)0x0) {
            sVar8 = strlen(pcVar10);
            iVar6 = curlx_uztosi(sVar8);
          }
          iVar6 = local_4c - iVar6;
          local_4c = iVar6;
          sVar8 = strlen((conn->proto).ftpc.prevpath);
          iVar7 = curlx_uztosi(sVar8);
          if ((iVar6 == iVar7) &&
             (iVar6 = curl_strnequal(pcVar11,(conn->proto).ftpc.prevpath,(long)local_4c), iVar6 != 0
             )) {
            Curl_infof(pSVar15,"Request has same path as previous transfer\n");
            (conn->proto).ftpc.cwddone = true;
          }
          (*Curl_cfree)(pcVar11);
          return CURLE_OK;
        }
        goto LAB_00117f17;
      }
      Curl_failf(pSVar14,"Uploading to a URL without a file name!");
    }
    else {
      pSVar14 = conn->data;
LAB_00117cc2:
      pcVar11 = curl_easy_unescape(pSVar14,pcVar11,0,(int *)0x0);
      (conn->proto).ftpc.file = pcVar11;
      if (pcVar11 == (char *)0x0) {
        freedirs(ftpc);
        Curl_failf(pSVar15,"no memory");
        goto LAB_00117f1c;
      }
      _Var5 = isBadFtpString(pcVar11);
      if (!_Var5) goto LAB_00117cfc;
LAB_00117ced:
      freedirs(ftpc);
    }
    CVar12 = CURLE_URL_MALFORMAT;
  }
  return CVar12;
}

Assistant:

static
CURLcode ftp_parse_url_path(struct connectdata *conn)
{
  struct SessionHandle *data = conn->data;
  /* the ftp struct is already inited in ftp_connect() */
  struct FTP *ftp = data->state.proto.ftp;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  const char *slash_pos;  /* position of the first '/' char in curpos */
  const char *path_to_use = data->state.path;
  const char *cur_pos;
  const char *filename = NULL;

  cur_pos = path_to_use; /* current position in path. point at the begin
                            of next path component */

  ftpc->ctl_valid = FALSE;
  ftpc->cwdfail = FALSE;

  switch(data->set.ftp_filemethod) {
  case FTPFILE_NOCWD:
    /* fastest, but less standard-compliant */

    /*
      The best time to check whether the path is a file or directory is right
      here. so:

      the first condition in the if() right here, is there just in case
      someone decides to set path to NULL one day
   */
    if(data->state.path &&
       data->state.path[0] &&
       (data->state.path[strlen(data->state.path) - 1] != '/') )
      filename = data->state.path;  /* this is a full file path */
      /*
        ftpc->file is not used anywhere other than for operations on a file.
        In other words, never for directory operations.
        So we can safely leave filename as NULL here and use it as a
        argument in dir/file decisions.
      */
    break;

  case FTPFILE_SINGLECWD:
    /* get the last slash */
    if(!path_to_use[0]) {
      /* no dir, no file */
      ftpc->dirdepth = 0;
      break;
    }
    slash_pos=strrchr(cur_pos, '/');
    if(slash_pos || !*cur_pos) {
      ftpc->dirs = calloc(1, sizeof(ftpc->dirs[0]));
      if(!ftpc->dirs)
        return CURLE_OUT_OF_MEMORY;

      ftpc->dirs[0] = curl_easy_unescape(conn->data, slash_pos ? cur_pos : "/",
                                         slash_pos ?
                                         curlx_sztosi(slash_pos-cur_pos) : 1,
                                         NULL);
      if(!ftpc->dirs[0]) {
        freedirs(ftpc);
        return CURLE_OUT_OF_MEMORY;
      }
      ftpc->dirdepth = 1; /* we consider it to be a single dir */
      filename = slash_pos ? slash_pos+1 : cur_pos; /* rest is file name */
    }
    else
      filename = cur_pos;  /* this is a file name only */
    break;

  default: /* allow pretty much anything */
  case FTPFILE_MULTICWD:
    ftpc->dirdepth = 0;
    ftpc->diralloc = 5; /* default dir depth to allocate */
    ftpc->dirs = calloc(ftpc->diralloc, sizeof(ftpc->dirs[0]));
    if(!ftpc->dirs)
      return CURLE_OUT_OF_MEMORY;

    /* we have a special case for listing the root dir only */
    if(strequal(path_to_use, "/")) {
      cur_pos++; /* make it point to the zero byte */
      ftpc->dirs[0] = strdup("/");
      ftpc->dirdepth++;
    }
    else {
      /* parse the URL path into separate path components */
      while((slash_pos = strchr(cur_pos, '/')) != NULL) {
        /* 1 or 0 pointer offset to indicate absolute directory */
        ssize_t absolute_dir = ((cur_pos - data->state.path > 0) &&
                                (ftpc->dirdepth == 0))?1:0;

        /* seek out the next path component */
        if(slash_pos-cur_pos) {
          /* we skip empty path components, like "x//y" since the FTP command
             CWD requires a parameter and a non-existent parameter a) doesn't
             work on many servers and b) has no effect on the others. */
          int len = curlx_sztosi(slash_pos - cur_pos + absolute_dir);
          ftpc->dirs[ftpc->dirdepth] =
            curl_easy_unescape(conn->data, cur_pos - absolute_dir, len, NULL);
          if(!ftpc->dirs[ftpc->dirdepth]) { /* run out of memory ... */
            failf(data, "no memory");
            freedirs(ftpc);
            return CURLE_OUT_OF_MEMORY;
          }
          if(isBadFtpString(ftpc->dirs[ftpc->dirdepth])) {
            free(ftpc->dirs[ftpc->dirdepth]);
            freedirs(ftpc);
            return CURLE_URL_MALFORMAT;
          }
        }
        else {
          cur_pos = slash_pos + 1; /* jump to the rest of the string */
          continue;
        }

        cur_pos = slash_pos + 1; /* jump to the rest of the string */
        if(++ftpc->dirdepth >= ftpc->diralloc) {
          /* enlarge array */
          char **bigger;
          ftpc->diralloc *= 2; /* double the size each time */
          bigger = realloc(ftpc->dirs, ftpc->diralloc * sizeof(ftpc->dirs[0]));
          if(!bigger) {
            freedirs(ftpc);
            return CURLE_OUT_OF_MEMORY;
          }
          ftpc->dirs = bigger;
        }
      }
    }
    filename = cur_pos;  /* the rest is the file name */
    break;
  } /* switch */

  if(filename && *filename) {
    ftpc->file = curl_easy_unescape(conn->data, filename, 0, NULL);
    if(NULL == ftpc->file) {
      freedirs(ftpc);
      failf(data, "no memory");
      return CURLE_OUT_OF_MEMORY;
    }
    if(isBadFtpString(ftpc->file)) {
      freedirs(ftpc);
      return CURLE_URL_MALFORMAT;
    }
  }
  else
    ftpc->file=NULL; /* instead of point to a zero byte, we make it a NULL
                       pointer */

  if(data->set.upload && !ftpc->file && (ftp->transfer == FTPTRANSFER_BODY)) {
    /* We need a file name when uploading. Return error! */
    failf(data, "Uploading to a URL without a file name!");
    return CURLE_URL_MALFORMAT;
  }

  ftpc->cwddone = FALSE; /* default to not done */

  if(ftpc->prevpath) {
    /* prevpath is "raw" so we convert the input path before we compare the
       strings */
    int dlen;
    char *path = curl_easy_unescape(conn->data, data->state.path, 0, &dlen);
    if(!path) {
      freedirs(ftpc);
      return CURLE_OUT_OF_MEMORY;
    }

    dlen -= ftpc->file?curlx_uztosi(strlen(ftpc->file)):0;
    if((dlen == curlx_uztosi(strlen(ftpc->prevpath))) &&
       strnequal(path, ftpc->prevpath, dlen)) {
      infof(data, "Request has same path as previous transfer\n");
      ftpc->cwddone = TRUE;
    }
    free(path);
  }

  return CURLE_OK;
}